

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O2

void UnitTest::CheckEqual<int,FIX::LeavesQty>
               (TestResults *results,int *expected,LeavesQty *actual,TestDetails *details)

{
  int iVar1;
  ostream *poVar2;
  char *failure;
  double dVar3;
  MemoryOutStream stream;
  MemoryOutStream local_1c0;
  
  iVar1 = *expected;
  dVar3 = FIX::DoubleField::getValue(&actual->super_QtyField);
  if ((dVar3 != (double)iVar1) || (NAN(dVar3) || NAN((double)iVar1))) {
    MemoryOutStream::MemoryOutStream(&local_1c0);
    poVar2 = std::operator<<((ostream *)&local_1c0,"Expected ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*expected);
    poVar2 = std::operator<<(poVar2," but was ");
    std::operator<<(poVar2,(string *)&(actual->super_QtyField).super_FieldBase.m_string);
    failure = MemoryOutStream::GetText(&local_1c0);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream(&local_1c0);
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}